

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O0

void __thiscall leveldb::DBTest_ManualCompaction_Test::TestBody(DBTest_ManualCompaction_Test *this)

{
  DB *pDVar1;
  bool bVar2;
  Message *message;
  char *pcVar3;
  AssertHelper local_3b0;
  Message local_3a8;
  string local_3a0;
  undefined1 local_380 [8];
  AssertionResult gtest_ar_8;
  Message local_368;
  string local_360;
  undefined1 local_340 [8];
  AssertionResult gtest_ar_7;
  string local_328;
  allocator local_301;
  string local_300;
  AssertHelper local_2e0;
  Message local_2d8;
  string local_2d0;
  undefined1 local_2b0 [8];
  AssertionResult gtest_ar_6;
  Slice local_290;
  AssertHelper local_280;
  Message local_278;
  string local_270;
  undefined1 local_250 [8];
  AssertionResult gtest_ar_5;
  string local_238;
  allocator local_211;
  string local_210;
  AssertHelper local_1f0;
  Message local_1e8;
  string local_1e0;
  undefined1 local_1c0 [8];
  AssertionResult gtest_ar_4;
  Slice local_1a0;
  AssertHelper local_190;
  Message local_188;
  string local_180;
  undefined1 local_160 [8];
  AssertionResult gtest_ar_3;
  Slice local_140;
  AssertHelper local_130;
  Message local_128;
  string local_120;
  undefined1 local_100 [8];
  AssertionResult gtest_ar_2;
  Slice local_e0;
  AssertHelper local_d0;
  Message local_c8;
  string local_c0;
  undefined1 local_a0 [8];
  AssertionResult gtest_ar_1;
  string local_88;
  allocator local_61;
  string local_60;
  uint local_3c;
  AssertHelper local_38;
  Message local_30;
  int local_24;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  DBTest_ManualCompaction_Test *this_local;
  
  local_24 = 2;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_20,"config::kMaxMemCompactLevel","2",&config::kMaxMemCompactLevel,
             &local_24);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar2) {
    testing::Message::Message(&local_30);
    message = testing::Message::operator<<
                        (&local_30,
                         (char (*) [54])"Need to update this test to match kMaxMemCompactLevel");
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
               ,0x635,pcVar3);
    testing::internal::AssertHelper::operator=(&local_38,message);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    testing::Message::~Message(&local_30);
  }
  local_3c = (uint)!bVar2;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  if (local_3c == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_60,"p",&local_61);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_88,"q",
               (allocator *)
               ((long)&gtest_ar_1.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl + 7));
    DBTest::MakeTables(&this->super_DBTest,3,&local_60,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&gtest_ar_1.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl + 7));
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
    DBTest::FilesPerLevel_abi_cxx11_(&local_c0,&this->super_DBTest);
    testing::internal::EqHelper::
    Compare<char[6],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
              ((EqHelper *)local_a0,"\"1,1,1\"","FilesPerLevel()",(char (*) [6])"1,1,1",&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
    if (!bVar2) {
      testing::Message::Message(&local_c8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_a0);
      testing::internal::AssertHelper::AssertHelper
                (&local_d0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                 ,0x639,pcVar3);
      testing::internal::AssertHelper::operator=(&local_d0,&local_c8);
      testing::internal::AssertHelper::~AssertHelper(&local_d0);
      testing::Message::~Message(&local_c8);
    }
    local_3c = (uint)!bVar2;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
    if (local_3c == 0) {
      Slice::Slice(&local_e0,"");
      Slice::Slice((Slice *)&gtest_ar_2.message_,"c");
      DBTest::Compact(&this->super_DBTest,&local_e0,(Slice *)&gtest_ar_2.message_);
      DBTest::FilesPerLevel_abi_cxx11_(&local_120,&this->super_DBTest);
      testing::internal::EqHelper::
      Compare<char[6],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                ((EqHelper *)local_100,"\"1,1,1\"","FilesPerLevel()",(char (*) [6])"1,1,1",
                 &local_120);
      std::__cxx11::string::~string((string *)&local_120);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
      if (!bVar2) {
        testing::Message::Message(&local_128);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_100);
        testing::internal::AssertHelper::AssertHelper
                  (&local_130,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                   ,0x63d,pcVar3);
        testing::internal::AssertHelper::operator=(&local_130,&local_128);
        testing::internal::AssertHelper::~AssertHelper(&local_130);
        testing::Message::~Message(&local_128);
      }
      local_3c = (uint)!bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
      if (local_3c == 0) {
        Slice::Slice(&local_140,"r");
        Slice::Slice((Slice *)&gtest_ar_3.message_,"z");
        DBTest::Compact(&this->super_DBTest,&local_140,(Slice *)&gtest_ar_3.message_);
        DBTest::FilesPerLevel_abi_cxx11_(&local_180,&this->super_DBTest);
        testing::internal::EqHelper::
        Compare<char[6],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                  ((EqHelper *)local_160,"\"1,1,1\"","FilesPerLevel()",(char (*) [6])"1,1,1",
                   &local_180);
        std::__cxx11::string::~string((string *)&local_180);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
        if (!bVar2) {
          testing::Message::Message(&local_188);
          pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_160);
          testing::internal::AssertHelper::AssertHelper
                    (&local_190,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                     ,0x641,pcVar3);
          testing::internal::AssertHelper::operator=(&local_190,&local_188);
          testing::internal::AssertHelper::~AssertHelper(&local_190);
          testing::Message::~Message(&local_188);
        }
        local_3c = (uint)!bVar2;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
        if (local_3c == 0) {
          Slice::Slice(&local_1a0,"p1");
          Slice::Slice((Slice *)&gtest_ar_4.message_,"p9");
          DBTest::Compact(&this->super_DBTest,&local_1a0,(Slice *)&gtest_ar_4.message_);
          DBTest::FilesPerLevel_abi_cxx11_(&local_1e0,&this->super_DBTest);
          testing::internal::EqHelper::
          Compare<char[6],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                    ((EqHelper *)local_1c0,"\"0,0,1\"","FilesPerLevel()",(char (*) [6])"0,0,1",
                     &local_1e0);
          std::__cxx11::string::~string((string *)&local_1e0);
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c0);
          if (!bVar2) {
            testing::Message::Message(&local_1e8);
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1c0);
            testing::internal::AssertHelper::AssertHelper
                      (&local_1f0,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                       ,0x645,pcVar3);
            testing::internal::AssertHelper::operator=(&local_1f0,&local_1e8);
            testing::internal::AssertHelper::~AssertHelper(&local_1f0);
            testing::Message::~Message(&local_1e8);
          }
          local_3c = (uint)!bVar2;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c0);
          if (local_3c == 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_210,"c",&local_211);
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_238,"e",
                       (allocator *)
                       ((long)&gtest_ar_5.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl + 7));
            DBTest::MakeTables(&this->super_DBTest,3,&local_210,&local_238);
            std::__cxx11::string::~string((string *)&local_238);
            std::allocator<char>::~allocator
                      ((allocator<char> *)
                       ((long)&gtest_ar_5.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl + 7));
            std::__cxx11::string::~string((string *)&local_210);
            std::allocator<char>::~allocator((allocator<char> *)&local_211);
            DBTest::FilesPerLevel_abi_cxx11_(&local_270,&this->super_DBTest);
            testing::internal::EqHelper::
            Compare<char[6],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                      ((EqHelper *)local_250,"\"1,1,2\"","FilesPerLevel()",(char (*) [6])"1,1,2",
                       &local_270);
            std::__cxx11::string::~string((string *)&local_270);
            bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_250);
            if (!bVar2) {
              testing::Message::Message(&local_278);
              pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_250);
              testing::internal::AssertHelper::AssertHelper
                        (&local_280,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                         ,0x649,pcVar3);
              testing::internal::AssertHelper::operator=(&local_280,&local_278);
              testing::internal::AssertHelper::~AssertHelper(&local_280);
              testing::Message::~Message(&local_278);
            }
            local_3c = (uint)!bVar2;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_250);
            if (local_3c == 0) {
              Slice::Slice(&local_290,"b");
              Slice::Slice((Slice *)&gtest_ar_6.message_,"f");
              DBTest::Compact(&this->super_DBTest,&local_290,(Slice *)&gtest_ar_6.message_);
              DBTest::FilesPerLevel_abi_cxx11_(&local_2d0,&this->super_DBTest);
              testing::internal::EqHelper::
              Compare<char[6],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                        ((EqHelper *)local_2b0,"\"0,0,2\"","FilesPerLevel()",(char (*) [6])"0,0,2",
                         &local_2d0);
              std::__cxx11::string::~string((string *)&local_2d0);
              bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b0);
              if (!bVar2) {
                testing::Message::Message(&local_2d8);
                pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2b0);
                testing::internal::AssertHelper::AssertHelper
                          (&local_2e0,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                           ,0x64d,pcVar3);
                testing::internal::AssertHelper::operator=(&local_2e0,&local_2d8);
                testing::internal::AssertHelper::~AssertHelper(&local_2e0);
                testing::Message::~Message(&local_2d8);
              }
              local_3c = (uint)!bVar2;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b0);
              if (local_3c == 0) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string((string *)&local_300,"a",&local_301);
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          ((string *)&local_328,"z",
                           (allocator *)
                           ((long)&gtest_ar_7.message_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl + 7));
                DBTest::MakeTables(&this->super_DBTest,1,&local_300,&local_328);
                std::__cxx11::string::~string((string *)&local_328);
                std::allocator<char>::~allocator
                          ((allocator<char> *)
                           ((long)&gtest_ar_7.message_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl + 7));
                std::__cxx11::string::~string((string *)&local_300);
                std::allocator<char>::~allocator((allocator<char> *)&local_301);
                DBTest::FilesPerLevel_abi_cxx11_(&local_360,&this->super_DBTest);
                testing::internal::EqHelper::
                Compare<char[6],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                          ((EqHelper *)local_340,"\"0,1,2\"","FilesPerLevel()",(char (*) [6])"0,1,2"
                           ,&local_360);
                std::__cxx11::string::~string((string *)&local_360);
                bVar2 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_340);
                if (!bVar2) {
                  testing::Message::Message(&local_368);
                  pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_340);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar_8.message_,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                             ,0x651,pcVar3);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar_8.message_,&local_368);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar_8.message_);
                  testing::Message::~Message(&local_368);
                }
                local_3c = (uint)!bVar2;
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_340);
                if (local_3c == 0) {
                  pDVar1 = (this->super_DBTest).db_;
                  (*pDVar1->_vptr_DB[0xb])(pDVar1,0);
                  DBTest::FilesPerLevel_abi_cxx11_(&local_3a0,&this->super_DBTest);
                  testing::internal::EqHelper::
                  Compare<char[6],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                            ((EqHelper *)local_380,"\"0,0,1\"","FilesPerLevel()",
                             (char (*) [6])"0,0,1",&local_3a0);
                  std::__cxx11::string::~string((string *)&local_3a0);
                  bVar2 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_380);
                  if (!bVar2) {
                    testing::Message::Message(&local_3a8);
                    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_380)
                    ;
                    testing::internal::AssertHelper::AssertHelper
                              (&local_3b0,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                               ,0x653,pcVar3);
                    testing::internal::AssertHelper::operator=(&local_3b0,&local_3a8);
                    testing::internal::AssertHelper::~AssertHelper(&local_3b0);
                    testing::Message::~Message(&local_3a8);
                  }
                  local_3c = (uint)!bVar2;
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_380);
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

TEST_F(DBTest, ManualCompaction) {
  ASSERT_EQ(config::kMaxMemCompactLevel, 2)
      << "Need to update this test to match kMaxMemCompactLevel";

  MakeTables(3, "p", "q");
  ASSERT_EQ("1,1,1", FilesPerLevel());

  // Compaction range falls before files
  Compact("", "c");
  ASSERT_EQ("1,1,1", FilesPerLevel());

  // Compaction range falls after files
  Compact("r", "z");
  ASSERT_EQ("1,1,1", FilesPerLevel());

  // Compaction range overlaps files
  Compact("p1", "p9");
  ASSERT_EQ("0,0,1", FilesPerLevel());

  // Populate a different range
  MakeTables(3, "c", "e");
  ASSERT_EQ("1,1,2", FilesPerLevel());

  // Compact just the new range
  Compact("b", "f");
  ASSERT_EQ("0,0,2", FilesPerLevel());

  // Compact all
  MakeTables(1, "a", "z");
  ASSERT_EQ("0,1,2", FilesPerLevel());
  db_->CompactRange(nullptr, nullptr);
  ASSERT_EQ("0,0,1", FilesPerLevel());
}